

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Performance::anon_unknown_1::BufferInUseRenderTimeCase::init
          (BufferInUseRenderTimeCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  DrawMethod DVar1;
  UploadBufferTarget UVar2;
  int iVar3;
  size_t sVar4;
  int numBytes;
  int numBytes_00;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  char *__s;
  MessageBuilder message;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [384];
  
  RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::init
            (&this->
              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
             ,ctx);
  DVar1 = (this->
          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          ).m_drawMethod;
  pcVar7 = "drawElements";
  if (DVar1 == DRAWMETHOD_DRAW_ARRAYS) {
    pcVar7 = "drawArrays";
  }
  pcVar5 = "mapBufferRange";
  if (this->m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA) {
    pcVar5 = "bufferSubData";
  }
  __s = "bufferData";
  if (this->m_uploadMethod != UPLOADMETHOD_BUFFER_DATA) {
    __s = pcVar5;
  }
  UVar2 = this->m_uploadBufferTarget;
  local_1b0._0_8_ =
       ((this->
        super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
        ).super_RenderPerformanceTestBase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Measuring the time used in ",0x1b);
  lVar6 = (ulong)(DVar1 != DRAWMETHOD_DRAW_ARRAYS) * 2 + 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar7,lVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00," call, a buffer upload, ",0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar7,lVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             " call using the uploaded buffer and readPixels call with different upload sizes.\n",
             0x51);
  iVar3 = (int)this_00;
  if (UVar2 == UPLOADBUFFERTARGET_DIFFERENT_BUFFER) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Rendering:\n",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"    before test: create and use buffers B and C\n",0x30);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"    first draw: render using buffer B\n",0x26);
    pcVar7 = (char *)0x0;
    if (this->m_uploadRange == UPLOADRANGE_PARTIAL) {
      pcVar7 = "    upload: modify buffer C contents\n";
    }
    pcVar5 = "    upload: respecify buffer C contents\n";
    if (this->m_uploadRange != UPLOADRANGE_FULL) {
      pcVar5 = pcVar7;
    }
    if (pcVar5 == (char *)0x0) {
      std::ios::clear(iVar3 + (int)*(undefined8 *)(local_1b0._8_8_ + -0x18));
    }
    else {
      sVar4 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar5,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"    second draw: render using buffer C\n",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"    read: readPixels\n",0x15);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Rendering:\n",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"    before test: create and use buffer B\n",0x29);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"    first draw: render using buffer B\n",0x26);
    pcVar7 = (char *)0x0;
    if (this->m_uploadRange == UPLOADRANGE_PARTIAL) {
      pcVar7 = "    upload: modify buffer B contents\n";
    }
    pcVar5 = "    upload: respecify buffer B contents\n";
    if (this->m_uploadRange != UPLOADRANGE_FULL) {
      pcVar5 = pcVar7;
    }
    if (pcVar5 == (char *)0x0) {
      std::ios::clear(iVar3 + (int)*(undefined8 *)(local_1b0._8_8_ + -0x18));
    }
    else {
      sVar4 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar5,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"    second draw: render using buffer B\n",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"    read: readPixels\n",0x15);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Uploading using ",0x10);
  sVar4 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar4);
  if ((ulong)this->m_mapFlags < 3) {
    pcVar7 = (&PTR_anon_var_dwarf_534c_00d16e88)[this->m_mapFlags];
    sVar4 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar7,sVar4);
  }
  else {
    std::ios::clear(iVar3 + (int)*(undefined8 *)(local_1b0._8_8_ + -0x18));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
  std::ostream::operator<<
            (this_00,(int)((ulong)((long)(this->
                                         super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                                         ).m_results.
                                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->
                                        super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                                        ).m_results.
                                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x45d1745d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00," test samples. Sample order is randomized.\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "All samples at even positions (first = 0) are tested before samples at odd positions.\n"
             ,0x56);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Workload sizes are in the range [",0x21);
  iVar3 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          ::getMinWorkloadSize
                    ((RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                      *)(this->
                        super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                        ).m_results.
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  std::ostream::operator<<(this_00,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",  ",3);
  iVar3 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          ::getMaxWorkloadSize
                    ((RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                      *)(this->
                        super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                        ).m_results.
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  std::ostream::operator<<(this_00,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"] vertices ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"([",2);
  iVar3 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          ::getMinWorkloadSize
                    ((RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                      *)(this->
                        super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                        ).m_results.
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  (anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1d0,(_anonymous_namespace_ *)(ulong)(uint)(iVar3 << 5),numBytes);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
  iVar3 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          ::getMaxWorkloadSize
                    ((RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                      *)(this->
                        super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                        ).m_results.
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  (anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1f0,(_anonymous_namespace_ *)(ulong)(uint)(iVar3 << 5),numBytes_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"] to be processed).\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Test result is the approximated processing rate in MiB / s of the second draw call and the readPixels call.\n"
             ,0x6c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  pcVar7 = 
  "Note! Test result may not be useful as is but instead should be compared against the buffer.render_after_upload.reference.draw_upload_draw group results.\n"
  ;
  if (UVar2 == UPLOADBUFFERTARGET_DIFFERENT_BUFFER) {
    pcVar7 = 
    "Note! Test result should only be used as a baseline reference result for buffer.render_after_upload.draw_modify_draw test group results."
    ;
  }
  lVar6 = 0x9a;
  if (UVar2 == UPLOADBUFFERTARGET_DIFFERENT_BUFFER) {
    lVar6 = 0x88;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar7,lVar6);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  iVar3 = std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  return iVar3;
}

Assistant:

void BufferInUseRenderTimeCase::init (void)
{
	RenderCase<RenderUploadRenderReadDuration>::init();

	// log
	{
		const char* const	targetFunctionName		= (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) ? ("drawArrays") : ("drawElements");
		const char* const	uploadFunctionName		= (m_uploadMethod == UPLOADMETHOD_BUFFER_DATA) ? ("bufferData") : (m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA) ? ("bufferSubData") : ("mapBufferRange");
		const bool			isReferenceCase			= (m_uploadBufferTarget == UPLOADBUFFERTARGET_DIFFERENT_BUFFER);
		tcu::MessageBuilder	message					(&m_testCtx.getLog());

		message	<< "Measuring the time used in " << targetFunctionName << " call, a buffer upload, "
				<< targetFunctionName << " call using the uploaded buffer and readPixels call with different upload sizes.\n";

		if (isReferenceCase)
			message << "Rendering:\n"
					<< "    before test: create and use buffers B and C\n"
					<< "    first draw: render using buffer B\n"
					<< ((m_uploadRange == UPLOADRANGE_FULL)		? ("    upload: respecify buffer C contents\n")	:
						(m_uploadRange == UPLOADRANGE_PARTIAL)	? ("    upload: modify buffer C contents\n")	:
						((const char*)DE_NULL))
					<< "    second draw: render using buffer C\n"
					<< "    read: readPixels\n";
		else
			message << "Rendering:\n"
					<< "    before test: create and use buffer B\n"
					<< "    first draw: render using buffer B\n"
					<< ((m_uploadRange == UPLOADRANGE_FULL)		? ("    upload: respecify buffer B contents\n")	:
						(m_uploadRange == UPLOADRANGE_PARTIAL)	? ("    upload: modify buffer B contents\n")	:
						((const char*)DE_NULL))
					<< "    second draw: render using buffer B\n"
					<< "    read: readPixels\n";

		message	<< "Uploading using " << uploadFunctionName
					<< ((m_mapFlags == MAPFLAG_INVALIDATE_RANGE)	? (", flags = MAP_WRITE_BIT | MAP_INVALIDATE_RANGE_BIT")	:
						(m_mapFlags == MAPFLAG_INVALIDATE_BUFFER)	? (", flags = MAP_WRITE_BIT | MAP_INVALIDATE_BUFFER_BIT")	:
						(m_mapFlags == MAPFLAG_NONE)				? ("")														:
						((const char*)DE_NULL))
					<< "\n"
				<< getNumSamples() << " test samples. Sample order is randomized.\n"
				<< "All samples at even positions (first = 0) are tested before samples at odd positions.\n"
				<< "Workload sizes are in the range ["
					<< getMinWorkloadSize() << ",  "
					<< getMaxWorkloadSize() << "] vertices "
					<< "(["
					<< getHumanReadableByteSize(getMinWorkloadDataSize()) << ","
					<< getHumanReadableByteSize(getMaxWorkloadDataSize()) << "] to be processed).\n"
				<< "Test result is the approximated processing rate in MiB / s of the second draw call and the readPixels call.\n";

		if (isReferenceCase)
			message	<< "Note! Test result should only be used as a baseline reference result for buffer.render_after_upload.draw_modify_draw test group results.";
		else
			message	<< "Note! Test result may not be useful as is but instead should be compared against the buffer.render_after_upload.reference.draw_upload_draw group results.\n";

		message << tcu::TestLog::EndMessage;
	}
}